

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::CodeHolder::detach(CodeHolder *this,BaseEmitter *emitter)

{
  bool bVar1;
  uint32_t uVar2;
  BaseEmitter *in_RSI;
  CodeHolder *in_RDI;
  uint32_t index;
  Error err;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  Error local_1c;
  
  if (in_RSI == (BaseEmitter *)0x0) {
    local_1c = DebugUtils::errored(2);
  }
  else if (in_RSI->_code == in_RDI) {
    local_1c = 0;
    bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                      (in_RSI->_emitterFlags,kDestroyed);
    if (!bVar1) {
      local_1c = (*in_RSI->_vptr_BaseEmitter[0x11])(in_RSI,in_RDI);
    }
    uVar2 = ZoneVector<asmjit::v1_14::BaseEmitter_*>::indexOf
                      (&in_RDI->_emitters,(BaseEmitter **)&stack0xffffffffffffffd0);
    if (uVar2 == 0xffffffff) {
      DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
    }
    ZoneVector<asmjit::v1_14::BaseEmitter_*>::removeAt
              ((ZoneVector<asmjit::v1_14::BaseEmitter_*> *)in_RSI,CONCAT44(local_1c,uVar2));
    in_RSI->_code = (CodeHolder *)0x0;
  }
  else {
    local_1c = DebugUtils::errored(3);
  }
  return local_1c;
}

Assistant:

Error CodeHolder::detach(BaseEmitter* emitter) noexcept {
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(emitter->_code != this))
    return DebugUtils::errored(kErrorInvalidState);

  // NOTE: We always detach if we were asked to, if error happens during
  // `emitter->onDetach()` we just propagate it, but the BaseEmitter will
  // be detached.
  Error err = kErrorOk;
  if (!emitter->isDestroyed())
    err = emitter->onDetach(this);

  // Disconnect CodeHolder <-> BaseEmitter.
  uint32_t index = _emitters.indexOf(emitter);
  ASMJIT_ASSERT(index != Globals::kNotFound);

  _emitters.removeAt(index);
  emitter->_code = nullptr;

  return err;
}